

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

StreamOut * prvTidyFileOutput(TidyDocImpl *doc,FILE *fp,int encoding,uint nl)

{
  StreamOut *pSVar1;
  
  pSVar1 = (StreamOut *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x20);
  pSVar1->nl = 0;
  pSVar1->iotype = FileIO;
  (pSVar1->sink).sinkData = (void *)0x0;
  (pSVar1->sink).putByte = (TidyPutByteFunc)0x0;
  pSVar1->encoding = encoding;
  pSVar1->state = FSM_ASCII;
  pSVar1->nl = nl;
  prvTidyinitFileSink(&pSVar1->sink,fp);
  pSVar1->iotype = FileIO;
  return pSVar1;
}

Assistant:

StreamOut* TY_(FileOutput)( TidyDocImpl *doc, FILE* fp, int encoding, uint nl )
{
    StreamOut* out = initStreamOut( doc, encoding, nl );
    TY_(initFileSink)( &out->sink, fp );
    out->iotype = FileIO;
    return out;
}